

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen12Texture.cpp
# Opt level: O0

GMM_STATUS __thiscall
GmmLib::GmmGen12TextureCalc::GetCCSExMode(GmmGen12TextureCalc *this,GMM_TEXTURE_INFO *AuxSurf)

{
  SKU_FEATURE_TABLE *pSVar1;
  uint32_t local_2c;
  GMM_TEXTURE_INFO *AuxSurf_local;
  GmmGen12TextureCalc *this_local;
  
  if ((((((ulong)(AuxSurf->Flags).Info >> 0x24 & 1) != 0) ||
       (((ulong)(AuxSurf->Flags).Info >> 0x2b & 1) != 0)) ||
      (((ulong)(AuxSurf->Flags).Info >> 0x26 & 1) != 0)) ||
     ((((ulong)(AuxSurf->Flags).Info >> 0x2c & 1) != 0 ||
      (((ulong)(AuxSurf->Flags).Info >> 0x13 & 1) != 0)))) {
    pSVar1 = Context::GetSkuTable
                       ((this->super_GmmGen11TextureCalc).super_GmmGen10TextureCalc.
                        super_GmmGen9TextureCalc.super_GmmTextureCalc.pGmmLibContext);
    if (((ulong)pSVar1->field_1 >> 0x12 & 1) == 0) {
      (AuxSurf->Flags).Gpu =
           (anon_struct_8_45_9b07292e_for_Gpu)
           ((ulong)(AuxSurf->Flags).Gpu & 0xfffffdffffffffff | 0x20000000000);
      if (AuxSurf->Type == RESOURCE_CUBE) {
        AuxSurf->ArraySize = 6;
      }
      AuxSurf->Type = RESOURCE_2D;
    }
    else {
      (AuxSurf->Flags).Gpu =
           (anon_struct_8_45_9b07292e_for_Gpu)
           ((ulong)(AuxSurf->Flags).Gpu & 0xfffff7ffffffffff | 0x80000000000);
    }
    if (((ulong)(AuxSurf->Flags).Gpu >> 0x29 & 1) != 0) {
      AuxSurf->CCSModeAlign = 0;
      GmmTextureCalc::SetTileMode((GmmTextureCalc *)this,AuxSurf);
      if ((int)AuxSurf->TileMode < 0xd) {
        local_2c = 0x60;
      }
      else {
        local_2c = AuxSurf->TileMode - TILE_YF_2D_8bpe;
      }
      AuxSurf->CCSModeAlign = local_2c;
      AuxSurf->TileMode = TILE_NONE;
      if (0x5f < AuxSurf->CCSModeAlign) {
        return GMM_INVALIDPARAM;
      }
      return GMM_SUCCESS;
    }
  }
  return GMM_SUCCESS;
}

Assistant:

GMM_STATUS GMM_STDCALL GmmLib::GmmGen12TextureCalc::GetCCSExMode(GMM_TEXTURE_INFO *AuxSurf)
{
    if(GMM_IS_4KB_TILE(AuxSurf->Flags) || GMM_IS_64KB_TILE(AuxSurf->Flags) || AuxSurf->Flags.Info.Linear)
    {
        if(pGmmLibContext->GetSkuTable().FtrLinearCCS)
 	{
            AuxSurf->Flags.Gpu.__NonMsaaLinearCCS = 1;
        }
        else
        {
            AuxSurf->Flags.Gpu.__NonMsaaTileYCcs = 1;
            //CCS is always 2D, even for 3D surface
            if(AuxSurf->Type == RESOURCE_CUBE)
            {
                AuxSurf->ArraySize = 6;
            }
            AuxSurf->Type = RESOURCE_2D;
        }
        if(AuxSurf->Flags.Gpu.__NonMsaaTileYCcs)
        {
            AuxSurf->CCSModeAlign = 0;
            SetTileMode(AuxSurf);
            /*if (AuxSurf->Flags.Gpu.UnifiedAuxSurface)*/
            {
                AuxSurf->CCSModeAlign = CCS_MODE(AuxSurf->TileMode);
            }
            AuxSurf->TileMode = TILE_NONE;

            __GMM_ASSERT(AuxSurf->CCSModeAlign < CCS_MODES);
            return (AuxSurf->CCSModeAlign < CCS_MODES) ? GMM_SUCCESS : GMM_INVALIDPARAM;
        }
    }
    return GMM_SUCCESS;
}